

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::string_maker<std::byte>::to_string_abi_cxx11_(byte *value)

{
  string *in_RDI;
  ostringstream os;
  string *os_00;
  ostringstream local_188 [392];
  
  os_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::operator<<(local_188,std::boolalpha);
  nonstd::operator<<((ostream *)os_00,(byte *)0x1274cc);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }